

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::compute_A_tile_int8_scales
               (Mat *A,Mat *scales,float B_scale,Mat *out_descales,int i,int max_ii)

{
  int in_stack_000001b0;
  int in_stack_000001b4;
  Mat *in_stack_000001b8;
  float in_stack_000001c4;
  Mat *in_stack_000001c8;
  Mat *in_stack_000001d0;
  
  compute_A_tile_fp32_int8_scales
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,
             in_stack_000001b4,in_stack_000001b0);
  return;
}

Assistant:

static void compute_A_tile_int8_scales(const Mat& A, Mat& scales, float B_scale, Mat& out_descales, int i, int max_ii)
{
    compute_A_tile_fp32_int8_scales(A, scales, B_scale, out_descales, i, max_ii);
}